

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinplacetext.cpp
# Opt level: O2

void Am_Inplace_Move_Cursor_Left(Am_Object *text)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  Am_Value *pAVar4;
  long *plVar5;
  ushort uVar6;
  Am_Object AStack_38;
  Am_String value;
  Am_Object local_28;
  
  uVar6 = (ushort)text;
  pAVar4 = (Am_Value *)Am_Object::Get(uVar6,0xad);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  if (iVar3 < 1) {
    pAVar4 = (Am_Value *)Am_Object::Get(uVar6,(ulong)Am_INPLACE_TEXT_NAV);
    plVar5 = (long *)Am_Value::operator_cast_to_void_(pAVar4);
    if (plVar5 != (long *)0x0) {
      pAVar4 = (Am_Value *)Am_Object::Get(uVar6,0xab);
      Am_String::Am_String(&value,pAVar4);
      bVar1 = Am_String::operator==(&value,"");
      cVar2 = (**(code **)(*plVar5 + (ulong)bVar1 * 0x10))(plVar5,2);
      Am_Object::Note_Changed(uVar6);
      if (cVar2 != '\0') {
        Am_Object::Am_Object(&AStack_38,text);
        Am_Move_Cursor_To_End((Am_Object_Data *)&AStack_38);
        Am_Object::~Am_Object(&AStack_38);
      }
      Am_String::~Am_String(&value);
    }
  }
  else {
    Am_Object::Am_Object(&local_28,text);
    Am_Move_Cursor_Left((Am_Object_Data *)&local_28,1);
    Am_Object::~Am_Object(&local_28);
  }
  return;
}

Assistant:

static void
Am_Inplace_Move_Cursor_Left(Am_Object text)
{
  //int str_len = strlen (Am_String (text.Get (Am_TEXT)));
  int index = text.Get(Am_CURSOR_INDEX);
  if (index > 0)
    Am_Move_Cursor_Left(text, 1);
  else {
    Am_Text_Navigate *text_nav =
        Am_Text_Navigate::Narrow((Am_Ptr)text.Get(Am_INPLACE_TEXT_NAV));
    if (text_nav) {
      Am_String value = text.Get(Am_TEXT);
      bool success;
      if (value == "")
        success = text_nav->Delete(Am_INPLACE_LEFT);
      else
        success = text_nav->Move(Am_INPLACE_LEFT);
      text.Note_Changed(Am_INPLACE_TEXT_INFO);
      if (success)
        Am_Move_Cursor_To_End(text);
    }
  }
}